

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O0

int compress_lzma(Byte *out,uint *outlen,Byte *in,uint inlen)

{
  uint uVar1;
  SRes SVar2;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int i;
  int offset;
  size_t comp_len;
  size_t props_size;
  CLzmaEncProps lzma_props;
  uint inlen_local;
  Byte *in_local;
  uint *outlen_local;
  Byte *out_local;
  
  if (*outlen < 10) {
    out_local._4_4_ = -1;
  }
  else if (((out == (Byte *)0x0) || (in == (Byte *)0x0)) || (inlen == 0)) {
    out_local._4_4_ = -1;
  }
  else {
    lzma_props.numThreads = inlen;
    LzmaEncProps_Init((CLzmaEncProps *)&props_size);
    uVar1 = *outlen;
    SVar2 = LzmaEncode((Byte *)lzma_props.reduceSize,(SizeT *)lzma_props._0_8_,(Byte *)props_size,5,
                       (CLzmaEncProps *)(ulong)(uVar1 - 9),
                       (Byte *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (SizeT *)lzma_props._32_8_,lzma_props.numHashBytes,
                       (ICompressProgress *)CONCAT44(lzma_props.numThreads,lzma_props.writeEndMark),
                       (ISzAlloc *)in,(ISzAlloc *)outlen);
    if (SVar2 == 0) {
      out_local._4_4_ = 0;
      builtin_memcpy(out,"\x0f\x0e\x05",4);
      *outlen = uVar1;
    }
    else {
      out_local._4_4_ = -1;
    }
  }
  return out_local._4_4_;
}

Assistant:

int compress_lzma(Byte *out, unsigned int *outlen, const Byte *in, unsigned int inlen)
{
	CLzmaEncProps lzma_props;
	size_t props_size;
	size_t comp_len;
	int offset;

	if (*outlen < 1 + 4 + LZMA_PROPS_SIZE)
	{
		// Not enough room for LZMA properties header + compressed data.
		return -1;
	}
	if (out == NULL || in == NULL || inlen == 0)
	{
		return -1;
	}

	LzmaEncProps_Init(&lzma_props);
//	lzma_props.level = 9;
	props_size = LZMA_PROPS_SIZE;
	comp_len = *outlen - 4 - LZMA_PROPS_SIZE;

	if (SZ_OK != LzmaEncode(out + 4 + LZMA_PROPS_SIZE, &comp_len, in, inlen, &lzma_props,
		out + 4, &props_size, 0, NULL, &Alloc, &Alloc))
	{
		return -1;
	}
	// Fill in LZMA properties header
	offset = 0;
	if (props_size != LZMA_PROPS_SIZE)
	{
		// Move LZMA properties to be adjacent to the compressed data, because for
		// some reaseon the library didn't use all the space provided.
		int i;

		offset = (int)(LZMA_PROPS_SIZE - props_size);
		for (i = 4 + LZMA_PROPS_SIZE - 1; i > 4 + offset; --i)
		{
			out[i] = out[i - offset];
		}
	}
	out[offset] = MY_VER_MAJOR;
	out[offset+1] = MY_VER_MINOR;
	out[offset+2] = (Byte)props_size;
	out[offset+3] = 0;
	// Add header length to outlen
	*outlen = (unsigned int)(comp_len + 4 + props_size);
	return offset;
}